

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

sector_t_conflict * __thiscall sector_t::GetHeightSec(sector_t *this)

{
  uint uVar1;
  F3DFloor **ppFVar2;
  uint local_1c;
  uint i;
  sector_t_conflict *this_local;
  
  if (this->heightsec == (sector_t *)0x0) {
    this_local = (sector_t_conflict *)0x0;
  }
  else if ((this->heightsec->MoreFlags & 0x10) == 0) {
    if ((this->e == (extsector_t *)0x0) ||
       (uVar1 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&this->e->XFloor), uVar1 == 0)) {
LAB_005e1d65:
      this_local = (sector_t_conflict *)this->heightsec;
    }
    else {
      local_1c = TArray<F3DFloor_*,_F3DFloor_*>::Size
                           ((TArray<F3DFloor_*,_F3DFloor_*> *)&this->e->XFloor);
      do {
        if (local_1c == 0) goto LAB_005e1d65;
        ppFVar2 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                            ((TArray<F3DFloor_*,_F3DFloor_*> *)&this->e->XFloor,
                             (ulong)(local_1c - 1));
        local_1c = local_1c - 1;
      } while (((*ppFVar2)->flags & 9) != 9);
      this_local = (sector_t_conflict *)0x0;
    }
  }
  else {
    this_local = (sector_t_conflict *)0x0;
  }
  return this_local;
}

Assistant:

sector_t *sector_t::GetHeightSec() const 
{
	if (heightsec == NULL)
	{
		return NULL;
	}
	if (heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC)
	{
		return NULL;
	}
	if (e && e->XFloor.ffloors.Size())
	{
		// If any of these fake floors render their planes, ignore heightsec.
		for (unsigned i = e->XFloor.ffloors.Size(); i-- > 0; )
		{
			if ((e->XFloor.ffloors[i]->flags & (FF_EXISTS | FF_RENDERPLANES)) == (FF_EXISTS | FF_RENDERPLANES))
			{
				return NULL;
			}
		}
	}
	return heightsec;
}